

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O2

add_node_status_t
libtorrent::dht::replace_node_impl
          (node_entry *e,bucket_t *b,ip_set *ips,int bucket_index,int bucket_size_limit,
          bool last_bucket,dht_logger *log)

{
  pointer pnVar1;
  __normal_iterator<const___gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  __first;
  __normal_iterator<const___gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  __last;
  pointer pnVar2;
  rep rVar3;
  rep rVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  node_id nid;
  node_id nid_00;
  node_id nid_01;
  node_id nid_02;
  pointer pnVar10;
  pointer p_Var11;
  uint8_t uVar12;
  byte bVar13;
  bool bVar14;
  byte bVar15;
  int iVar16;
  undefined4 uVar17;
  node_entry *pnVar18;
  pointer pnVar19;
  add_node_status_t aVar20;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *n;
  pointer p_Var21;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *__s;
  pointer p_Var22;
  pointer pnVar23;
  char *pcVar24;
  long lVar25;
  ip_set *this;
  pointer p_Var26;
  node_entry *pnVar27;
  span<const_char> in;
  value_type local_cd8;
  int local_ccc;
  aux *local_cc8;
  node_entry *local_cc0;
  pointer local_cb8;
  pointer local_cb0;
  ip_set *local_ca8;
  uint local_c9c;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  replace_candidates;
  string local_c70;
  uint local_c50;
  undefined4 local_c4c;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  array<std::vector<bucket_t::iterator>,_128> nodes_storage;
  
  local_cd8._M_current =
       (b->super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
       super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pnVar1 = (b->
           super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
           super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar2 = local_cd8._M_current;
  if (local_cd8._M_current != pnVar1) {
    while (pnVar19 = pnVar2 + 1, pnVar19 != pnVar1) {
      bVar13 = 0;
      if ((local_cd8._M_current)->timeout_count != 0xff) {
        bVar13 = (local_cd8._M_current)->timeout_count;
      }
      pnVar10 = pnVar2 + 1;
      pnVar23 = pnVar19;
      if (pnVar10->timeout_count <= bVar13) {
        pnVar23 = local_cd8._M_current;
      }
      pnVar2 = pnVar19;
      if (pnVar10->timeout_count != 0xff) {
        local_cd8._M_current = pnVar23;
      }
    }
  }
  if ((byte)((local_cd8._M_current)->timeout_count + 1) < 2) {
    local_cc8 = (aux *)&e->id;
    nid.m_number._M_elems[3] = (int)((ulong)*(undefined8 *)((e->id).m_number._M_elems + 2) >> 0x20);
    nid.m_number._M_elems._0_12_ = *(undefined1 (*) [12])(e->id).m_number._M_elems;
    nid.m_number._M_elems[4] = (e->id).m_number._M_elems[4];
    local_ccc = bucket_index;
    local_ca8 = ips;
    uVar12 = classify_prefix(bucket_index,last_bucket,bucket_size_limit,nid);
    local_cb0 = (pointer)CONCAT71(local_cb0._1_7_,uVar12);
    __s = (vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
           *)&nodes_storage;
    memset(__s,0,0xc00);
    local_cb8 = (pointer)(long)bucket_size_limit;
    for (local_cd8._M_current =
              (b->
              super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
              ).
              super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
        local_cd8._M_current !=
        (b->super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>)
        .
        super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish; local_cd8._M_current = local_cd8._M_current + 1)
    {
      nid_00.m_number._M_elems[3] =
           (int)((ulong)*(undefined8 *)(((local_cd8._M_current)->id).m_number._M_elems + 2) >> 0x20)
      ;
      nid_00.m_number._M_elems._0_12_ =
           *(undefined1 (*) [12])((local_cd8._M_current)->id).m_number._M_elems;
      nid_00.m_number._M_elems[4] = ((local_cd8._M_current)->id).m_number._M_elems[4];
      bVar13 = classify_prefix(local_ccc,last_bucket,bucket_size_limit,nid_00);
      ::std::
      vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ::push_back(nodes_storage.
                  super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                  ._M_elems + bVar13,&local_cd8);
    }
    p_Var21 = nodes_storage.
              super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
              ._M_elems[(ulong)local_cb0 & 0xff].
              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var26 = nodes_storage.
              super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
              ._M_elems[(ulong)local_cb0 & 0xff].
              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    p_Var11 = p_Var21;
    local_cc0 = e;
    if (p_Var21 == p_Var26) {
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (lVar25 = (long)local_cb8 * 0x18;
          p_Var21 = replace_candidates.
                    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, lVar25 != 0; lVar25 = lVar25 + -0x18
          ) {
        __first._M_current =
             ((array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
               *)&__s->
                  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             )->_M_elems[0].
             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             ((array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
               *)&__s->
                  super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             )->_M_elems[0].
             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (8 < (ulong)((long)__last._M_current - (long)__first._M_current)) {
          ::std::
          vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
          ::
          insert<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>,void>
                    ((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                      *)&replace_candidates,
                     (const_iterator)
                     replace_candidates.
                     super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__first,__last);
        }
        __s = __s + 1;
      }
      p_Var11 = replace_candidates.
                super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var22 = replace_candidates.
                super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var26 = replace_candidates.
                super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (replace_candidates.
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          replace_candidates.
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        while (p_Var22 = p_Var11, p_Var26 = p_Var26 + 1, p_Var26 != p_Var21) {
          bVar14 = node_entry::operator<(p_Var22->_M_current,p_Var26->_M_current);
          p_Var11 = p_Var26;
          if (!bVar14) {
            p_Var11 = p_Var22;
          }
        }
      }
      pnVar27 = local_cc0;
      local_cd8._M_current = p_Var22->_M_current;
      ::std::
      _Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ::~_Vector_base(&replace_candidates.
                       super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                     );
      pnVar18 = (b->
                super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                ).
                super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      while (p_Var22 = p_Var11, pnVar27 = local_cc0, p_Var21 = p_Var21 + 1, p_Var21 != p_Var26) {
        bVar14 = node_entry::operator<(p_Var22->_M_current,p_Var21->_M_current);
        p_Var11 = p_Var21;
        if (!bVar14) {
          p_Var11 = p_Var22;
        }
      }
      local_cd8._M_current = p_Var22->_M_current;
      bVar14 = node_entry::operator<(local_cc0,local_cd8._M_current);
      pnVar18 = (b->
                super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                ).
                super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar14) {
        local_cd8._M_current = pnVar18;
      }
    }
    this = local_ca8;
    if (local_cd8._M_current == pnVar18) {
      aVar20 = need_bucket_split;
    }
    else {
      if ((log != (dht_logger *)0x0) &&
         (iVar16 = (**log->_vptr_dht_logger)(log,2), (char)iVar16 != '\0')) {
        in.m_len = (difference_type)pnVar18;
        in.m_ptr = (char *)0x14;
        aux::to_hex_abi_cxx11_((string *)&replace_candidates,local_cc8,in);
        bVar14 = ((pnVar27->endpoint).addr.field_0x10 & 1) == 0;
        if (bVar14) {
          local_c48 = *(undefined8 *)&(pnVar27->endpoint).addr.addr;
          uStack_c40 = *(undefined8 *)((long)&(pnVar27->endpoint).addr.addr + 8);
          local_c4c = 0;
        }
        else {
          local_c4c = *(undefined4 *)(pnVar27->endpoint).addr.addr.v4._M_elems;
          local_c48 = 0;
          uStack_c40 = 0;
        }
        local_c50 = (uint)bVar14;
        local_c38 = 0;
        local_cb0 = replace_candidates.
                    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        aux::print_address_abi_cxx11_
                  (&local_c70,(aux *)&local_c50,
                   (address *)
                   replace_candidates.
                   super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        iVar16 = local_ccc;
        local_cb8 = local_c70._M_dataplus._M_p;
        uVar17 = 0x39a984;
        pcVar24 = "not-verified";
        if (pnVar27->verified != false) {
          pcVar24 = "verified";
        }
        local_c9c = (uint)pnVar27->rtt;
        nid_01.m_number._M_elems[3] = (int)((ulong)*(undefined8 *)(local_cc8 + 8) >> 0x20);
        nid_01.m_number._M_elems._0_12_ = *(undefined1 (*) [12])local_cc8;
        nid_01.m_number._M_elems[4] = *(uint *)(local_cc8 + 0x10);
        bVar13 = classify_prefix(local_ccc,last_bucket,bucket_size_limit,nid_01);
        bVar14 = (local_cd8._M_current)->verified;
        local_cc8 = (aux *)CONCAT44(local_cc8._4_4_,(uint)(local_cd8._M_current)->rtt);
        nid_02.m_number._M_elems[3] =
             (int)((ulong)*(undefined8 *)(((local_cd8._M_current)->id).m_number._M_elems + 2) >>
                  0x20);
        nid_02.m_number._M_elems._0_12_ =
             *(undefined1 (*) [12])((local_cd8._M_current)->id).m_number._M_elems;
        nid_02.m_number._M_elems[4] = ((local_cd8._M_current)->id).m_number._M_elems[4];
        bVar15 = classify_prefix(iVar16,last_bucket,bucket_size_limit,nid_02);
        if (bVar14 != false) {
          uVar17 = 0x39a988;
        }
        (*log->_vptr_dht_logger[1])
                  (log,2,"replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]",
                   local_cb0,local_cb8,pcVar24,local_c9c,(uint)bVar13,uVar17,local_cc8._0_4_,
                   (uint)bVar15);
        ::std::__cxx11::string::~string((string *)&local_c70);
        ::std::__cxx11::string::~string((string *)&replace_candidates);
        this = local_ca8;
        pnVar27 = local_cc0;
      }
      bVar14 = (((local_cd8._M_current)->endpoint).addr.field_0x10 & 1) == 0;
      if (bVar14) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)&((local_cd8._M_current)->endpoint).addr.addr;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&((local_cd8._M_current)->endpoint).addr.addr + 8);
        uVar17 = 0;
      }
      else {
        uVar17 = *(undefined4 *)((local_cd8._M_current)->endpoint).addr.addr.v4._M_elems;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar17,(uint)bVar14);
      ip_set::erase(this,(address *)&replace_candidates);
      rVar3 = (pnVar27->first_seen).__d.__r;
      rVar4 = (pnVar27->last_queried).__d.__r;
      uVar5 = *(undefined8 *)(pnVar27->id).m_number._M_elems;
      uVar6 = *(undefined8 *)((pnVar27->id).m_number._M_elems + 2);
      uVar7 = *(undefined8 *)((pnVar27->id).m_number._M_elems + 4);
      uVar8 = *(undefined8 *)((long)&(pnVar27->endpoint).addr.addr + 4);
      uVar9 = *(undefined8 *)&(pnVar27->endpoint).addr.field_0x10;
      *(undefined8 *)((long)&((local_cd8._M_current)->endpoint).addr.addr + 8) =
           *(undefined8 *)((long)&(pnVar27->endpoint).addr.addr + 8);
      *(undefined8 *)&((local_cd8._M_current)->endpoint).addr.field_0x10 = uVar9;
      *(undefined8 *)(((local_cd8._M_current)->id).m_number._M_elems + 4) = uVar7;
      *(undefined8 *)((long)&((local_cd8._M_current)->endpoint).addr.addr + 4) = uVar8;
      *(undefined8 *)((local_cd8._M_current)->id).m_number._M_elems = uVar5;
      *(undefined8 *)(((local_cd8._M_current)->id).m_number._M_elems + 2) = uVar6;
      ((local_cd8._M_current)->first_seen).__d.__r = rVar3;
      ((local_cd8._M_current)->last_queried).__d.__r = rVar4;
      bVar14 = ((pnVar27->endpoint).addr.field_0x10 & 1) == 0;
      if (bVar14) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(pnVar27->endpoint).addr.addr;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&(pnVar27->endpoint).addr.addr + 8);
        uVar17 = 0;
      }
      else {
        uVar17 = *(undefined4 *)(pnVar27->endpoint).addr.addr.v4._M_elems;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar17,(uint)bVar14);
      ip_set::insert(this,(address *)&replace_candidates);
      aVar20 = node_added;
    }
    ::std::
    array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ::~array(&nodes_storage.
              super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
            );
  }
  else {
    bVar14 = (((local_cd8._M_current)->endpoint).addr.field_0x10 & 1) == 0;
    if (bVar14) {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)&((local_cd8._M_current)->endpoint).addr.addr;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&((local_cd8._M_current)->endpoint).addr.addr + 8);
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    }
    else {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ =
           *(undefined4 *)((local_cd8._M_current)->endpoint).addr.addr.v4._M_elems;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)bVar14;
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[1].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ip_set::erase(ips,(address *)&nodes_storage);
    rVar3 = (e->first_seen).__d.__r;
    rVar4 = (e->last_queried).__d.__r;
    uVar5 = *(undefined8 *)(e->id).m_number._M_elems;
    uVar6 = *(undefined8 *)((e->id).m_number._M_elems + 2);
    uVar7 = *(undefined8 *)((e->id).m_number._M_elems + 4);
    uVar8 = *(undefined8 *)((long)&(e->endpoint).addr.addr + 4);
    uVar9 = *(undefined8 *)&(e->endpoint).addr.field_0x10;
    *(undefined8 *)((long)&((local_cd8._M_current)->endpoint).addr.addr + 8) =
         *(undefined8 *)((long)&(e->endpoint).addr.addr + 8);
    *(undefined8 *)&((local_cd8._M_current)->endpoint).addr.field_0x10 = uVar9;
    *(undefined8 *)(((local_cd8._M_current)->id).m_number._M_elems + 4) = uVar7;
    *(undefined8 *)((long)&((local_cd8._M_current)->endpoint).addr.addr + 4) = uVar8;
    *(undefined8 *)((local_cd8._M_current)->id).m_number._M_elems = uVar5;
    *(undefined8 *)(((local_cd8._M_current)->id).m_number._M_elems + 2) = uVar6;
    ((local_cd8._M_current)->first_seen).__d.__r = rVar3;
    ((local_cd8._M_current)->last_queried).__d.__r = rVar4;
    bVar14 = ((e->endpoint).addr.field_0x10 & 1) == 0;
    if (bVar14) {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(e->endpoint).addr.addr;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&(e->endpoint).addr.addr + 8);
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    }
    else {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ =
           *(undefined4 *)(e->endpoint).addr.addr.v4._M_elems;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)bVar14;
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[1].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ip_set::insert(ips,(address *)&nodes_storage);
    aVar20 = node_added;
  }
  return aVar20;
}

Assistant:

routing_table::add_node_status_t replace_node_impl(node_entry const& e
	, bucket_t& b, ip_set& ips, int const bucket_index
	, int const bucket_size_limit, bool const last_bucket
#ifndef TORRENT_DISABLE_LOGGING
	, dht_logger* log
#endif
	)
{
	// if the bucket isn't full, we're not replacing anything, and this function
	// should not have been called
	TORRENT_ASSERT(int(b.size()) >= bucket_size_limit);

	auto j = std::max_element(b.begin(), b.end()
		, [](node_entry const& lhs, node_entry const& rhs)
		{ return lhs.fail_count() < rhs.fail_count(); });
	TORRENT_ASSERT(j != b.end());

	if (j->fail_count() > 0)
	{
		// i points to a node that has been marked
		// as stale. Replace it with this new one
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}

	// then we look for nodes with the same 3 bit prefix (or however
	// many bits prefix the bucket size warrants). If there is no other
	// node with this prefix, remove the duplicate with the highest RTT.
	// as the last replacement strategy, if the node we found matching our
	// bit prefix has higher RTT than the new node, replace it.

	// in order to provide as few lookups as possible before finding
	// the data someone is looking for, make sure there is an affinity
	// towards having a good spread of node IDs in each bucket
	std::uint8_t const to_add_prefix = classify_prefix(bucket_index
		, last_bucket, bucket_size_limit, e.id);

	// nodes organized by their prefix
	aux::array<std::vector<bucket_t::iterator>, 128> nodes_storage;
	auto const nodes = span<std::vector<bucket_t::iterator>>{nodes_storage}.first(bucket_size_limit);

	for (j = b.begin(); j != b.end(); ++j)
	{
		std::uint8_t const prefix = classify_prefix(
			bucket_index, last_bucket, bucket_size_limit, j->id);
		TORRENT_ASSERT(prefix < nodes.size());
		nodes[prefix].push_back(j);
	}

	if (!nodes[to_add_prefix].empty())
	{
		j = *std::max_element(nodes[to_add_prefix].begin(), nodes[to_add_prefix].end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });

		// only if e is better than the worst node in this prefix slot do we
		// replace it. resetting j means we're not replacing it
		if (!(e < *j)) j = b.end();
	}
	else
	{
		// there is no node in this prefix slot. We definitely want to add it.
		// Now we just need to figure out which one to replace
		std::vector<bucket_t::iterator> replace_candidates;
		for (auto const& n : nodes)
		{
			if (n.size() > 1) replace_candidates.insert(replace_candidates.end(), n.begin(), n.end());
		}

		// since the bucket is full, and there's no node in the prefix-slot
		// we're about to add to, there must be at least one prefix slot that
		// has more than one node.
		TORRENT_ASSERT(!replace_candidates.empty());

		// from these nodes, pick the "worst" one and replace it
		j = *std::max_element(replace_candidates.begin(), replace_candidates.end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });
	}

	if (j != b.end())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (log != nullptr && log->should_log(dht_logger::routing_table))
		{
			log->log(dht_logger::routing_table, "replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]"
				, aux::to_hex(e.id).c_str(), aux::print_address(e.addr()).c_str()
				, e.verified ? "verified" : "not-verified", e.rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, e.id)
				, j->verified ? "verified" : "not-verified", j->rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, j->id)
				);
		}
#endif
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}
	return routing_table::need_bucket_split;
}